

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parquet.cpp
# Opt level: O2

shared_ptr<duckdb::ParquetEncryptionConfig,_true> __thiscall
duckdb::ParquetEncryptionConfig::Deserialize
          (ParquetEncryptionConfig *this,Deserializer *deserializer)

{
  ParquetEncryptionConfig *pPVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::ParquetEncryptionConfig,_true> sVar2;
  
  pPVar1 = (ParquetEncryptionConfig *)operator_new(0x58);
  ParquetEncryptionConfig(pPVar1);
  ::std::__shared_ptr<duckdb::ParquetEncryptionConfig,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<duckdb::ParquetEncryptionConfig,void>
            ((__shared_ptr<duckdb::ParquetEncryptionConfig,(__gnu_cxx::_Lock_policy)2> *)this,pPVar1
            );
  pPVar1 = shared_ptr<duckdb::ParquetEncryptionConfig,_true>::operator->
                     ((shared_ptr<duckdb::ParquetEncryptionConfig,_true> *)this);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,100,"footer_key",&pPVar1->footer_key);
  pPVar1 = shared_ptr<duckdb::ParquetEncryptionConfig,_true>::operator->
                     ((shared_ptr<duckdb::ParquetEncryptionConfig,_true> *)this);
  Deserializer::
  ReadPropertyWithDefault<std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
            (deserializer,0x65,"column_keys",&pPVar1->column_keys);
  sVar2.internal.super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.internal.super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = this;
  return (shared_ptr<duckdb::ParquetEncryptionConfig,_true>)
         sVar2.internal.
         super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<ParquetEncryptionConfig> ParquetEncryptionConfig::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::shared_ptr<ParquetEncryptionConfig>(new ParquetEncryptionConfig());
	deserializer.ReadPropertyWithDefault<string>(100, "footer_key", result->footer_key);
	deserializer.ReadPropertyWithDefault<unordered_map<string, string>>(101, "column_keys", result->column_keys);
	return result;
}